

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

void __thiscall
capnp::TwoPartyVatNetwork::OutgoingMessageImpl::OutgoingMessageImpl
          (OutgoingMessageImpl *this,TwoPartyVatNetwork *network,uint firstSegmentWordSize)

{
  uint local_44;
  uint firstSegmentWordSize_local;
  TwoPartyVatNetwork *network_local;
  OutgoingMessageImpl *this_local;
  
  OutgoingRpcMessage::OutgoingRpcMessage(&this->super_OutgoingRpcMessage);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_OutgoingRpcMessage)._vptr_OutgoingRpcMessage = (_func_int **)&PTR_getBody_00cd70b0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00cd70e0;
  this->network = network;
  local_44 = firstSegmentWordSize;
  if (firstSegmentWordSize == 0) {
    local_44 = 0x400;
  }
  MallocMessageBuilder::MallocMessageBuilder(&this->message,local_44,GROW_HEURISTICALLY);
  return;
}

Assistant:

OutgoingMessageImpl(TwoPartyVatNetwork& network, uint firstSegmentWordSize)
      : network(network),
        message(firstSegmentWordSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : firstSegmentWordSize) {}